

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O0

bool llvm::ConvertCodePointToUTF8(uint Source,char **ResultPtr)

{
  ConversionResult CVar1;
  ConversionResult CR;
  UTF8 *TargetEnd;
  UTF8 *TargetStart;
  UTF32 *SourceEnd;
  UTF32 *SourceStart;
  char **ResultPtr_local;
  uint Source_local;
  
  SourceEnd = (UTF32 *)&ResultPtr_local;
  TargetStart = (UTF8 *)((long)&ResultPtr_local + 4);
  TargetEnd = (UTF8 *)*ResultPtr;
  SourceStart = (UTF32 *)ResultPtr;
  ResultPtr_local._0_4_ = Source;
  CVar1 = ConvertUTF32toUTF8(&SourceEnd,(UTF32 *)TargetStart,&TargetEnd,TargetEnd + 4,
                             strictConversion);
  if (CVar1 == conversionOK) {
    *(UTF8 **)SourceStart = TargetEnd;
  }
  return CVar1 == conversionOK;
}

Assistant:

bool ConvertCodePointToUTF8(unsigned Source, char *&ResultPtr) {
  const UTF32 *SourceStart = &Source;
  const UTF32 *SourceEnd = SourceStart + 1;
  UTF8 *TargetStart = reinterpret_cast<UTF8 *>(ResultPtr);
  UTF8 *TargetEnd = TargetStart + 4;
  ConversionResult CR = ConvertUTF32toUTF8(&SourceStart, SourceEnd,
                                           &TargetStart, TargetEnd,
                                           strictConversion);
  if (CR != conversionOK)
    return false;

  ResultPtr = reinterpret_cast<char*>(TargetStart);
  return true;
}